

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualfilesystem.cpp
# Opt level: O1

optional<sai::VirtualFileEntry> * __thiscall
sai::VirtualFileSystem::GetEntry
          (optional<sai::VirtualFileEntry> *__return_storage_ptr__,VirtualFileSystem *this,
          char *Path)

{
  uint uVar1;
  int iVar2;
  char *__s1;
  long lVar3;
  bool bVar4;
  ulong uVar5;
  ulong uVar6;
  string CurPath;
  VirtualPage CurPage;
  VirtualPage TablePage;
  long *local_2050 [2];
  long local_2040 [2];
  int local_2030;
  char local_202c [34];
  char local_200a [2];
  uint local_2008 [1014];
  allocator<char> local_1030 [4];
  uint auStack_102c [1023];
  
  uVar5 = 0;
  memset(&local_2030,0,0x1000);
  std::istream::seekg((long)(this->FileStream).
                            super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      0x2000);
  std::istream::read((char *)(this->FileStream).
                             super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (long)&local_2030);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2050,Path,local_1030);
  __s1 = strtok((char *)local_2050[0],"./");
  while (__s1 != (char *)0x0) {
    uVar6 = 0;
    while( true ) {
      lVar3 = uVar6 * 0x40;
      if (*(int *)(local_202c + lVar3 + -4) == 0) goto LAB_00104447;
      iVar2 = strcmp(__s1,local_202c + lVar3);
      if (iVar2 == 0) break;
      if ((uVar6 == 0x3f) && (uVar5 != 0)) {
        memset(local_1030,0,0x1000);
        std::istream::seekg((long)(this->FileStream).
                                  super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,(_Ios_Seekdir)(uVar5 << 0xc) & 0xffe00000);
        std::istream::read((char *)(this->FileStream).
                                   super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr,(long)local_1030);
        uVar1 = auStack_102c[uVar5 * 2];
        if ((ulong)uVar1 == 0) {
          uVar6 = 0x3f;
          goto LAB_001043ef;
        }
        std::istream::seekg((long)(this->FileStream).
                                  super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr,uVar1 << 0xc);
        std::istream::read((char *)(this->FileStream).
                                   super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr,(long)&local_2030);
        uVar6 = 0;
        uVar5 = (ulong)uVar1;
      }
      else {
LAB_001043ef:
        uVar6 = uVar6 + 1;
      }
      if (0x3f < uVar6) goto LAB_00104447;
    }
    __s1 = strtok((char *)0x0,"./");
    if (__s1 == (char *)0x0) {
      bVar4 = true;
      std::_Optional_payload_base<sai::VirtualFileEntry>::_Storage<sai::VirtualFileEntry,false>::
      _Storage<std::shared_ptr<sai::ifstream>&,sai::FATEntry&>
                ((_Storage<sai::VirtualFileEntry,false> *)__return_storage_ptr__,this,
                 local_202c + lVar3 + -4);
      goto LAB_0010444d;
    }
    if (local_200a[lVar3] != '\x10') break;
    uVar5 = (ulong)local_2008[uVar6 * 0x10];
    std::istream::seekg((long)(this->FileStream).
                              super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        local_2008[uVar6 * 0x10] << 0xc);
    std::istream::read((char *)(this->FileStream).
                               super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (long)&local_2030);
  }
LAB_00104447:
  bVar4 = false;
LAB_0010444d:
  (__return_storage_ptr__->super__Optional_base<sai::VirtualFileEntry,_false,_false>)._M_payload.
  super__Optional_payload<sai::VirtualFileEntry,_true,_false,_false>.
  super__Optional_payload_base<sai::VirtualFileEntry>._M_engaged = bVar4;
  if (local_2050[0] != local_2040) {
    operator_delete(local_2050[0],local_2040[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::optional<VirtualFileEntry> VirtualFileSystem::GetEntry(const char* Path)
{
	VirtualPage CurPage = {};
	Read(2 * VirtualPage::PageSize, CurPage);

	std::string CurPath(Path);
	const char* PathDelim    = "./";
	const char* CurToken     = std::strtok(&CurPath[0], PathDelim);
	std::size_t CurEntry     = 0;
	std::size_t CurPageIndex = 0;

	while( CurEntry < 64 && CurPage.FATEntries[CurEntry].Flags && CurToken )
	{
		if( std::strcmp(CurToken, CurPage.FATEntries[CurEntry].Name) == 0 )
		{
			// Match
			if( (CurToken = std::strtok(nullptr, PathDelim)) == nullptr )
			{
				// No more tokens, done
				return std::make_optional<VirtualFileEntry>(
					FileStream, CurPage.FATEntries[CurEntry]
				);
			}
			// Try to go further
			if( CurPage.FATEntries[CurEntry].Type != FATEntry::EntryType::Folder )
			{
				// Part of the path was not a folder, cant go further
				return std::nullopt;
			}

			const std::uint32_t PageIndex = CurPage.FATEntries[CurEntry].PageIndex;
			Read(PageIndex * VirtualPage::PageSize, CurPage);
			CurEntry     = 0;
			CurPageIndex = PageIndex;
			continue;
		}

		// Last entry ( of this Page ), check if there are more after this.
		if( CurEntry == 63 && CurPageIndex )
		{
			// If a folder has more than 64 `FATEntries`, the `NextPageIndex`
			// field on the `PageEntry` will indicate on what `Page` the extra
			// entries are located.
			VirtualPage TablePage = {};
			Read(VirtualPage::NearestTableIndex(CurPageIndex) * VirtualPage::PageSize, TablePage);

			const std::uint32_t NextPageIndex = TablePage.PageEntries[CurPageIndex].NextPageIndex;
			if( NextPageIndex )
			{
				Read(NextPageIndex * VirtualPage::PageSize, CurPage);
				CurEntry     = 0;
				CurPageIndex = NextPageIndex;
				continue;
			}
		}

		CurEntry++;
	}

	return std::nullopt;
}